

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::TraverseSchema::traverseAttributeDecl
          (TraverseSchema *this,DOMElement *elem,ComplexTypeInfo *typeInfo,bool topLevel)

{
  short sVar1;
  short sVar2;
  XMLCh XVar3;
  XMLCh XVar4;
  SchemaInfo *pSVar5;
  DatatypeValidator *pDVar6;
  XMLStringPool *pXVar7;
  XercesAttGroupInfo *pXVar8;
  RefHashTableOf<xercesc_4_0::XMLAttDef,_xercesc_4_0::StringHasher> *this_00;
  bool bVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  XMLCh *toCheck;
  XMLCh *pXVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  XMLCh *pXVar15;
  DOMElement *pDVar16;
  DOMNode *node;
  short *psVar17;
  XSAnnotation *pXVar18;
  SchemaAttDef *pSVar19;
  long lVar20;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  unsigned_short elemContext;
  short *psVar21;
  short *psVar22;
  XMLCh *pXVar23;
  XMLSize_t count;
  XSAnnotation *pXVar24;
  size_t sVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  ArrayJanitor<char16_t> tempURIName;
  NamespaceScopeManager nsMgr;
  XMLCh *local_b8;
  AttTypes local_a0;
  DatatypeValidator *local_98;
  XMLCh *local_88;
  XMLCh *local_78;
  XMLCh *local_68;
  XMLCh *local_58;
  ArrayJanitor<char16_t> local_50;
  NamespaceScopeManager local_40;
  long *plVar14;
  undefined4 extraout_var_03;
  
  pSVar5 = this->fSchemaInfo;
  if (elem == (DOMElement *)0x0) {
    local_40.fScopeAdded = false;
  }
  else {
    local_40.fScopeAdded = retrieveNamespaceMapping(this,elem);
  }
  local_40.fSchemaInfo = pSVar5;
  toCheck = getElementAttValue(this,elem,(XMLCh *)SchemaSymbols::fgATT_NAME,NCName);
  pXVar13 = getElementAttValue(this,elem,L"ref",QName);
  if (toCheck == (XMLCh *)0x0) {
    bVar26 = false;
  }
  else {
    bVar26 = *toCheck != L'\0';
  }
  if (pXVar13 == (XMLCh *)0x0) {
    bVar27 = true;
  }
  else {
    bVar27 = *pXVar13 == L'\0';
  }
  iVar10 = 0x10;
  if (((~bVar27 & 1U) == 0 && !bVar26) || (iVar10 = 0xf, (~topLevel & 1U) == 0 && !bVar26)) {
    reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",iVar10);
    goto LAB_00334af2;
  }
  elemContext = 5;
  if (!topLevel) {
    elemContext = bVar27 ^ 7;
  }
  GeneralAttributeCheck::checkAttributes
            (&this->fAttributeCheck,elem,elemContext,this,topLevel,this->fNonXSAttList);
  iVar10 = (*(elem->super_DOMNode)._vptr_DOMNode[0x2a])(elem,SchemaSymbols::fgATT_DEFAULT);
  plVar14 = (long *)CONCAT44(extraout_var,iVar10);
  if (plVar14 == (long *)0x0) {
    local_88 = (XMLCh *)0x0;
  }
  else {
    local_88 = (XMLCh *)(**(code **)(*plVar14 + 0x150))(plVar14);
  }
  iVar10 = (*(elem->super_DOMNode)._vptr_DOMNode[0x2a])(elem,&SchemaSymbols::fgATT_FIXED);
  plVar14 = (long *)CONCAT44(extraout_var_00,iVar10);
  if (plVar14 == (long *)0x0) {
    local_58 = (XMLCh *)0x0;
  }
  else {
    local_58 = (XMLCh *)(**(code **)(*plVar14 + 0x150))(plVar14);
  }
  iVar10 = (*(elem->super_DOMNode)._vptr_DOMNode[0x2a])(elem,&SchemaSymbols::fgATT_USE);
  plVar14 = (long *)CONCAT44(extraout_var_01,iVar10);
  if (plVar14 == (long *)0x0) {
    local_68 = (XMLCh *)0x0;
  }
  else {
    local_68 = (XMLCh *)(**(code **)(*plVar14 + 0x150))(plVar14);
  }
  iVar10 = (*(elem->super_DOMNode)._vptr_DOMNode[0x2a])(elem,SchemaSymbols::fgATT_FORM);
  plVar14 = (long *)CONCAT44(extraout_var_02,iVar10);
  if (plVar14 == (long *)0x0) {
    local_98 = (DatatypeValidator *)0x0;
  }
  else {
    local_98 = (DatatypeValidator *)(**(code **)(*plVar14 + 0x150))(plVar14);
  }
  pXVar15 = getElementAttValue(this,elem,(XMLCh *)SchemaSymbols::fgATT_TYPE,QName);
  pDVar16 = XUtil::getFirstChildElement(&elem->super_DOMNode);
  node = &checkContent(this,elem,pDVar16,true,true)->super_DOMNode;
  pXVar24 = this->fAnnotation;
  bVar26 = false;
  do {
    if (node == (DOMNode *)0x0) {
      node = (DOMNode *)0x0;
      break;
    }
    iVar10 = (*node->_vptr_DOMNode[0x18])(node);
    psVar17 = (short *)CONCAT44(extraout_var_03,iVar10);
    if (psVar17 == &SchemaSymbols::fgELT_SIMPLETYPE) {
LAB_00334c88:
      pDVar16 = XUtil::getNextSiblingElement(node);
      if (pDVar16 != (DOMElement *)0x0) {
        bVar26 = true;
      }
      bVar28 = false;
    }
    else {
      psVar21 = &SchemaSymbols::fgELT_SIMPLETYPE;
      if (psVar17 == (short *)0x0) {
LAB_00334c70:
        if (*psVar21 == 0) goto LAB_00334c88;
      }
      else {
        psVar22 = &SchemaSymbols::fgELT_SIMPLETYPE;
        psVar21 = psVar17;
        do {
          sVar1 = *psVar22;
          if (sVar1 == 0) goto LAB_00334c70;
          psVar22 = psVar22 + 1;
          sVar2 = *psVar21;
          psVar21 = psVar21 + 1;
        } while (sVar1 == sVar2);
      }
      node = &XUtil::getNextSiblingElement(node)->super_DOMNode;
      bVar26 = true;
      bVar28 = true;
    }
  } while (bVar28);
  if (bVar26) {
    pXVar23 = toCheck;
    if (toCheck == (XMLCh *)0x0) {
      pXVar23 = pXVar13;
    }
    reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x4e,pXVar23,
                      (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
  }
  if (local_88 == (XMLCh *)0x0) {
    local_78 = local_58;
  }
  else {
    if (local_58 != (XMLCh *)0x0) {
      pXVar23 = toCheck;
      if (toCheck == (XMLCh *)0x0) {
        pXVar23 = pXVar13;
      }
      reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x2f,pXVar23,
                        (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
    }
    local_58 = local_88;
    if (local_68 == (XMLCh *)0x0) {
      local_68 = (XMLCh *)0x0;
      local_78 = (XMLCh *)0x0;
    }
    else if ((local_68 == L"optional") || (*local_68 == L'\0')) {
LAB_00334dd7:
      local_78 = (XMLCh *)0x0;
    }
    else {
      lVar20 = 0;
      do {
        psVar17 = (short *)((long)local_68 + lVar20);
        if (*psVar17 == 0) {
          if (*(short *)((long)&SchemaSymbols::fgATTVAL_OPTIONAL + lVar20) == 0) goto LAB_00334dd7;
          break;
        }
        psVar21 = (short *)((long)&SchemaSymbols::fgATTVAL_OPTIONAL + lVar20);
        lVar20 = lVar20 + 2;
      } while (*psVar17 == *psVar21);
      pXVar23 = toCheck;
      if (toCheck == (XMLCh *)0x0) {
        pXVar23 = pXVar13;
      }
      local_68 = (XMLCh *)0x0;
      reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x30,pXVar23,
                        (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
      local_78 = (XMLCh *)0x0;
    }
  }
  if (bVar27 == false && !topLevel) {
    if (((local_98 != (DatatypeValidator *)0x0) || (pXVar15 != (XMLCh *)0x0)) ||
       (node != (DOMNode *)0x0)) {
      pXVar15 = pXVar13;
      if (toCheck != (XMLCh *)0x0) {
        pXVar15 = toCheck;
      }
      reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x45,pXVar15,
                        (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
    }
    processAttributeDeclRef(this,elem,typeInfo,pXVar13,local_68,local_88,local_78);
  }
  else {
    pXVar18 = pXVar24;
    if (((this->fScanner->fGenerateSyntheticAnnotations == true) &&
        (this->fAnnotation == (XSAnnotation *)0x0)) && (this->fNonXSAttList->fCurCount != 0)) {
      pXVar18 = generateSyntheticAnnotation(this,elem,this->fNonXSAttList);
      this->fAnnotation = pXVar18;
      if (pXVar24 != (XSAnnotation *)0x0) {
        (*(pXVar24->super_XSerializable)._vptr_XSerializable[1])(pXVar24);
      }
    }
    pXVar24 = pXVar18;
    count = 0;
    if (toCheck != (XMLCh *)0x0) {
      do {
        psVar17 = (short *)((long)toCheck + count);
        count = count + 2;
      } while (*psVar17 != 0);
      count = ((long)count >> 1) - 1;
    }
    bVar26 = XMLChar1_0::isValidNCName(toCheck,count);
    if (bVar26 && toCheck != L"xmlns") {
      pXVar13 = L"xmlns";
      pXVar23 = toCheck;
      if (toCheck == (XMLCh *)0x0) {
LAB_00334f3d:
        if (*pXVar13 == L'\0') goto LAB_00334fbe;
      }
      else {
        do {
          XVar3 = *pXVar23;
          if (XVar3 == L'\0') goto LAB_00334f3d;
          pXVar23 = pXVar23 + 1;
          XVar4 = *pXVar13;
          pXVar13 = pXVar13 + 1;
        } while (XVar3 == XVar4);
      }
      uVar12 = this->fEmptyNamespaceURI;
      if (((this->fTargetNSURIString != (XMLCh *)0x0) && (*this->fTargetNSURIString != L'\0')) &&
         (((topLevel || (bVar26 = XMLString::equals((XMLCh *)local_98,L"qualified"), bVar26)) ||
          (((this->fSchemaInfo->fElemAttrDefaultQualified & 2) != 0 &&
           ((local_98 == (DatatypeValidator *)0x0 || (*(XMLCh *)local_98 == L'\0')))))))) {
        uVar12 = this->fTargetNSURI;
      }
      pXVar13 = this->fTargetNSURIString;
      iVar10 = 0x95;
      if (pXVar13 == L"http://www.w3.org/2001/XMLSchema-instance") {
LAB_0033503f:
        reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",iVar10,toCheck,
                          (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
      }
      else {
        pXVar23 = L"http://www.w3.org/2001/XMLSchema-instance";
        if (pXVar13 == (XMLCh *)0x0) {
LAB_00334fea:
          if (*pXVar23 == L'\0') goto LAB_0033503f;
        }
        else {
          do {
            XVar3 = *pXVar13;
            if (XVar3 == L'\0') goto LAB_00334fea;
            pXVar13 = pXVar13 + 1;
            XVar4 = *pXVar23;
            pXVar23 = pXVar23 + 1;
          } while (XVar3 == XVar4);
        }
        if (typeInfo != (ComplexTypeInfo *)0x0) {
          pSVar19 = RefHash2KeysTableOf<xercesc_4_0::SchemaAttDef,_xercesc_4_0::StringHasher>::get
                              (typeInfo->fAttDefs,toCheck,uVar12);
          iVar10 = 0x31;
          if (pSVar19 != (SchemaAttDef *)0x0) goto LAB_0033503f;
        }
        if (this->fCurrentAttGroupInfo != (XercesAttGroupInfo *)0x0) {
          bVar26 = XercesAttGroupInfo::containsAttribute(this->fCurrentAttGroupInfo,toCheck,uVar12);
          iVar10 = 0x31;
          if (bVar26) goto LAB_0033503f;
        }
        pSVar5 = this->fSchemaInfo;
        if (node == (DOMNode *)0x0) {
          if ((pXVar15 == (XMLCh *)0x0) || (*pXVar15 == L'\0')) {
            local_98 = DatatypeValidatorFactory::getDatatypeValidator
                                 (this->fDatatypeRegistry,L"anySimpleType");
            goto LAB_003351bb;
          }
          checkEnumerationRequiredNotation(this,elem,toCheck,pXVar15);
          local_b8 = getLocalPart(this,pXVar15);
          pXVar13 = getPrefix(this,pXVar15);
          pXVar13 = resolvePrefixToURI(this,elem,pXVar13);
          bVar26 = XMLString::equals(pXVar13,L"http://www.w3.org/2001/XMLSchema");
          if (bVar26) {
            local_98 = DatatypeValidatorFactory::getDatatypeValidator
                                 (this->fDatatypeRegistry,local_b8);
            bVar26 = local_98 == (DatatypeValidator *)0x0;
          }
          else {
            local_98 = getAttrDatatypeValidatorNS(this,elem,local_b8,pXVar13);
            bVar26 = true;
            for (pDVar6 = local_98; pDVar6 != (DatatypeValidator *)0x0;
                pDVar6 = pDVar6->fBaseValidator) {
              bVar27 = XMLString::equals(pDVar6->fTypeUri,L"http://www.w3.org/2001/XMLSchema");
              if (bVar27) {
                local_b8 = pDVar6->fTypeLocalName;
                bVar26 = false;
                break;
              }
            }
          }
          local_a0 = Simple;
          if (!bVar26) {
            bVar26 = XMLString::equals(local_b8,L"ID");
            local_a0 = ID;
            if (!bVar26) {
              bVar26 = XMLString::equals(local_b8,(XMLCh *)XMLUni::fgIDRefString);
              local_a0 = IDRef;
              if (!bVar26) {
                bVar26 = XMLString::equals(local_b8,(XMLCh *)XMLUni::fgIDRefsString);
                local_a0 = IDRefs;
                if (!bVar26) {
                  bVar26 = XMLString::equals(local_b8,L"ENTITY");
                  local_a0 = Entity;
                  if (!bVar26) {
                    bVar26 = XMLString::equals(local_b8,(XMLCh *)XMLUni::fgEntitiesString);
                    local_a0 = Entities;
                    if (!bVar26) {
                      bVar26 = XMLString::equals(local_b8,(XMLCh *)XMLUni::fgNmTokenString);
                      local_a0 = NmToken;
                      if (!bVar26) {
                        bVar26 = XMLString::equals(local_b8,(XMLCh *)XMLUni::fgNmTokensString);
                        local_a0 = NmTokens;
                        if (!bVar26) {
                          bVar26 = XMLString::equals(local_b8,L"NOTATION");
                          local_a0 = (uint)!bVar26 * 2 + Notation;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          if (local_98 == (DatatypeValidator *)0x0) {
            reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x33,pXVar13,
                              local_b8,toCheck,(XMLCh *)0x0);
          }
        }
        else {
          if ((pXVar15 != (XMLCh *)0x0) && (*pXVar15 != L'\0')) {
            reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x32,toCheck,
                              (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
          }
          local_98 = traverseSimpleTypeDecl(this,(DOMElement *)node,false,0);
LAB_003351bb:
          local_a0 = Simple;
        }
        this->fSchemaInfo = pSVar5;
        if (local_68 == (XMLCh *)0x0) {
          bVar26 = false;
          bVar27 = false;
        }
        else {
          if (*local_68 == L'\0') {
LAB_0033525b:
            bVar26 = false;
          }
          else {
            bVar26 = true;
            if (local_68 != L"required") {
              lVar20 = 0;
              do {
                psVar17 = (short *)((long)local_68 + lVar20);
                if (*psVar17 == 0) {
                  if (*(short *)((long)&SchemaSymbols::fgATTVAL_REQUIRED + lVar20) == 0)
                  goto LAB_00335263;
                  break;
                }
                psVar21 = (short *)((long)&SchemaSymbols::fgATTVAL_REQUIRED + lVar20);
                lVar20 = lVar20 + 2;
              } while (*psVar17 == *psVar21);
              if (local_68 == L"prohibited") {
                bVar27 = true;
LAB_003352d3:
                bVar26 = false;
                goto LAB_003352df;
              }
              lVar20 = 0;
              do {
                psVar17 = (short *)((long)local_68 + lVar20);
                if (*psVar17 == 0) {
                  bVar27 = *(short *)((long)&SchemaSymbols::fgATTVAL_PROHIBITED + lVar20) == 0;
                  goto LAB_003352d3;
                }
                psVar21 = (short *)((long)&SchemaSymbols::fgATTVAL_PROHIBITED + lVar20);
                lVar20 = lVar20 + 2;
              } while (*psVar17 == *psVar21);
              goto LAB_0033525b;
            }
          }
LAB_00335263:
          bVar27 = false;
        }
LAB_003352df:
        if (local_98 == (DatatypeValidator *)0x0) {
          bVar28 = false;
        }
        else {
          bVar28 = local_98->fType == ID;
        }
        if (((local_58 == (XMLCh *)0x0) || (local_a0 != Simple)) ||
           (local_98 == (DatatypeValidator *)0x0)) {
          if (((local_58 != (XMLCh *)0x0) &&
              (local_a0 == Entities || (local_a0 & ~Entity) == IDRefs)) &&
             (bVar9 = XMLString::isWSCollapsed(local_58), !bVar9)) {
            sVar25 = 0;
            do {
              psVar17 = (short *)((long)local_58 + sVar25);
              sVar25 = sVar25 + 2;
            } while (*psVar17 != 0);
            iVar10 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar25);
            pXVar13 = (XMLCh *)CONCAT44(extraout_var_05,iVar10);
            memcpy(pXVar13,local_58,sVar25);
            ArrayJanitor<char16_t>::ArrayJanitor(&local_50,pXVar13,this->fMemoryManager);
            XMLString::collapseWS(pXVar13,this->fMemoryManager);
            pXVar7 = this->fStringPool;
            uVar11 = (*(pXVar7->super_XSerializable)._vptr_XSerializable[5])(pXVar7,pXVar13);
            iVar10 = (*(pXVar7->super_XSerializable)._vptr_XSerializable[10])(pXVar7,(ulong)uVar11);
            local_58 = (XMLCh *)CONCAT44(extraout_var_06,iVar10);
            ArrayJanitor<char16_t>::~ArrayJanitor(&local_50);
          }
        }
        else {
          sVar1 = local_98->fWhiteSpace;
          if (((sVar1 == 1) && (bVar9 = XMLString::isWSReplaced(local_58), !bVar9)) ||
             ((sVar1 == 2 && (bVar9 = XMLString::isWSCollapsed(local_58), !bVar9)))) {
            sVar25 = 0;
            do {
              psVar17 = (short *)((long)local_58 + sVar25);
              sVar25 = sVar25 + 2;
            } while (*psVar17 != 0);
            iVar10 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar25);
            pXVar13 = (XMLCh *)CONCAT44(extraout_var_04,iVar10);
            memcpy(pXVar13,local_58,sVar25);
            ArrayJanitor<char16_t>::ArrayJanitor(&local_50,pXVar13,this->fMemoryManager);
            if (sVar1 == 1) {
              XMLString::replaceWS(pXVar13,this->fMemoryManager);
            }
            else if (sVar1 == 2) {
              XMLString::collapseWS(pXVar13,this->fMemoryManager);
            }
            pXVar7 = this->fStringPool;
            uVar11 = (*(pXVar7->super_XSerializable)._vptr_XSerializable[5])(pXVar7,pXVar13);
            iVar10 = (*(pXVar7->super_XSerializable)._vptr_XSerializable[10])(pXVar7,(ulong)uVar11);
            local_58 = (XMLCh *)CONCAT44(extraout_var_07,iVar10);
            ArrayJanitor<char16_t>::~ArrayJanitor(&local_50);
          }
          (*(local_98->super_XSerializable)._vptr_XSerializable[8])
                    (local_98,local_58,this->fSchemaInfo->fValidationContext,this->fMemoryManager);
        }
        if (local_58 != (XMLCh *)0x0 && !(bool)(bVar28 ^ 1U)) {
          reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x88,toCheck,
                            (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
        }
        if (!(bool)(bVar28 ^ 1U) && !topLevel) {
          pXVar8 = this->fCurrentAttGroupInfo;
          if (pXVar8 == (XercesAttGroupInfo *)0x0) {
            iVar10 = 0x89;
            if (typeInfo->fAttWithTypeId == true) goto LAB_0033554e;
            typeInfo->fAttWithTypeId = true;
          }
          else {
            iVar10 = 0x8a;
            if (pXVar8->fTypeWithId != false) {
LAB_0033554e:
              reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",iVar10,toCheck
                                ,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
              goto LAB_00335060;
            }
            pXVar8->fTypeWithId = true;
          }
        }
        pSVar19 = (SchemaAttDef *)XMemory::operator_new(0x68,this->fGrammarPoolMemoryManager);
        SchemaAttDef::SchemaAttDef
                  (pSVar19,L"",toCheck,uVar12,local_a0,Implied,this->fGrammarPoolMemoryManager);
        pSVar19->fDatatypeValidator = local_98;
        if (bVar27) {
          (pSVar19->super_XMLAttDef).fDefaultType = DefAttTypes_Max;
        }
        else if (bVar26) {
          if (local_78 == (XMLCh *)0x0) {
            (pSVar19->super_XMLAttDef).fDefaultType = Required;
          }
          else {
            (pSVar19->super_XMLAttDef).fDefaultType = Required_And_Fixed;
          }
        }
        else if (local_78 == (XMLCh *)0x0) {
          if (local_88 != (XMLCh *)0x0) {
            (pSVar19->super_XMLAttDef).fDefaultType = DefAttTypes_Min;
          }
        }
        else {
          (pSVar19->super_XMLAttDef).fDefaultType = Fixed;
        }
        if (local_58 != (XMLCh *)0x0) {
          XMLAttDef::setValue((XMLAttDef *)pSVar19,local_58);
        }
        pXVar18 = pXVar24;
        if (pXVar24 != (XSAnnotation *)0x0) {
          pXVar18 = (XSAnnotation *)0x0;
          SchemaGrammar::putAnnotation(this->fSchemaGrammar,pSVar19,pXVar24);
        }
        pXVar24 = pXVar18;
        if (topLevel) {
          pXVar7 = this->fStringPool;
          this_00 = this->fAttributeDeclRegistry;
          uVar12 = (*(pXVar7->super_XSerializable)._vptr_XSerializable[5])(pXVar7,toCheck);
          iVar10 = (*(pXVar7->super_XSerializable)._vptr_XSerializable[10])(pXVar7,(ulong)uVar12);
          RefHashTableOf<xercesc_4_0::XMLAttDef,_xercesc_4_0::StringHasher>::put
                    (this_00,(void *)CONCAT44(extraout_var_08,iVar10),(XMLAttDef *)pSVar19);
          pSVar19->fPSVIScope = SCP_GLOBAL;
        }
        else {
          if ((typeInfo != (ComplexTypeInfo *)0x0) &&
             (ComplexTypeInfo::addAttDef(typeInfo,pSVar19),
             this->fCurrentAttGroupInfo == (XercesAttGroupInfo *)0x0)) {
            pSVar19->fPSVIScope = SCP_LOCAL;
          }
          if (this->fCurrentAttGroupInfo != (XercesAttGroupInfo *)0x0) {
            XercesAttGroupInfo::addAttDef
                      (this->fCurrentAttGroupInfo,pSVar19,typeInfo != (ComplexTypeInfo *)0x0);
          }
        }
      }
    }
    else {
LAB_00334fbe:
      reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x35,L"attribute",
                        toCheck,(XMLCh *)0x0,(XMLCh *)0x0);
    }
  }
LAB_00335060:
  if (pXVar24 != (XSAnnotation *)0x0) {
    (*(pXVar24->super_XSerializable)._vptr_XSerializable[1])(pXVar24);
  }
LAB_00334af2:
  NamespaceScopeManager::~NamespaceScopeManager(&local_40);
  return;
}

Assistant:

void TraverseSchema::traverseAttributeDecl(const DOMElement* const elem,
                                           ComplexTypeInfo* const typeInfo,
                                           const bool topLevel) {

    NamespaceScopeManager nsMgr(elem, fSchemaInfo, this);

    const XMLCh*   name = getElementAttValue(elem, SchemaSymbols::fgATT_NAME, DatatypeValidator::NCName);
    const XMLCh*   ref = getElementAttValue(elem, SchemaSymbols::fgATT_REF, DatatypeValidator::QName);
    bool           nameEmpty = (!name || !*name);
    bool           refEmpty = (!ref || !*ref);

    if (nameEmpty && refEmpty) {
        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::NoNameRefAttribute);
        return;
    }

    if (topLevel && nameEmpty) {

        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::TopLevelNoNameAttribute);
        return;
    }

    // ------------------------------------------------------------------
    // Check attributes
    // ------------------------------------------------------------------
    unsigned short scope = (topLevel)
        ? GeneralAttributeCheck::E_AttributeGlobal
        : (refEmpty) ? GeneralAttributeCheck::E_AttributeLocal
                     : GeneralAttributeCheck::E_AttributeRef;

    fAttributeCheck.checkAttributes(elem, scope, this, topLevel, fNonXSAttList);

    const XMLCh* defaultVal = getElementAttValue(elem, SchemaSymbols::fgATT_DEFAULT);
    const XMLCh* fixedVal = getElementAttValue(elem, SchemaSymbols::fgATT_FIXED);
    const XMLCh* useVal = getElementAttValue(elem, SchemaSymbols::fgATT_USE);
    const XMLCh* attForm = getElementAttValue(elem, SchemaSymbols::fgATT_FORM);
    const XMLCh* dvType = getElementAttValue(elem, SchemaSymbols::fgATT_TYPE, DatatypeValidator::QName);
    DOMElement* simpleType = checkContent(elem, XUtil::getFirstChildElement(elem), true);
    Janitor<XSAnnotation> janAnnot(fAnnotation);
    bool         badContent = false;

    while (simpleType != 0) {

        const XMLCh* contentName = simpleType->getLocalName();

        if (XMLString::equals(SchemaSymbols::fgELT_SIMPLETYPE, contentName)) {

            if (XUtil::getNextSiblingElement(simpleType) != 0) {
                badContent = true;
            }
            break;
        }

        badContent = true;
        simpleType = XUtil::getNextSiblingElement(simpleType);
    }

    if (badContent) {
        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::InvalidAttributeContent,
                          (name) ? name : ref);
    }

    if (defaultVal) {

        if (fixedVal) {

            fixedVal = 0;
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::AttributeDefaultFixedValue,
                              (name) ? name : ref);
        }

        if ((useVal && *useVal)
            && !XMLString::equals(useVal, SchemaSymbols::fgATTVAL_OPTIONAL)) {

            useVal = 0;
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::NotOptionalDefaultAttValue,
                              (name) ? name : ref);
        }
    }

    // processing ref
    if (!refEmpty && !topLevel) {

        // Check ref representation OK - 3.2.3::3.2
        if (attForm || dvType || (simpleType != 0)) {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::AttributeRefContentError,
                              (name) ? name : ref);
        }

        processAttributeDeclRef(elem, typeInfo, ref, useVal, defaultVal, fixedVal);
        return;
    }

    if (fScanner->getGenerateSyntheticAnnotations() && !fAnnotation && fNonXSAttList->size())
    {
        fAnnotation = generateSyntheticAnnotation(elem, fNonXSAttList);
        janAnnot.reset(fAnnotation);
    }

    // processing 'name'
    if (!XMLChar1_0::isValidNCName(name, XMLString::stringLen(name))
        || XMLString::equals(name, XMLUni::fgXMLNSString)) {

        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::InvalidDeclarationName, SchemaSymbols::fgELT_ATTRIBUTE, name);
        return;
    }

    // Check for duplicate declaration
    const XMLCh* qualified = SchemaSymbols::fgATTVAL_QUALIFIED;
    int uriIndex = fEmptyNamespaceURI;

    if ((fTargetNSURIString && *fTargetNSURIString)
        && (topLevel || XMLString::equals(attForm, qualified)
            || ((fSchemaInfo->getElemAttrDefaultQualified() & Attr_Def_Qualified)
                && (!attForm || !*attForm)))) {
        uriIndex = fTargetNSURI;
    }

    // make sure that attribute namespace is not xsi uri
    if (XMLString::equals(fTargetNSURIString, SchemaSymbols::fgURI_XSI)) {

        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::InvalidAttTNS, name);
        return;
    }

    if (typeInfo && typeInfo->getAttDef(name, uriIndex) != 0) {

        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::DuplicateAttribute, name);
        return;
    }
    else if (fCurrentAttGroupInfo && fCurrentAttGroupInfo->containsAttribute(name, uriIndex)) {

        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::DuplicateAttribute, name);
        return;
    }

    DatatypeValidator*  dv = 0;
    XMLAttDef::AttTypes attType = XMLAttDef::Simple;
    SchemaInfo* saveInfo = fSchemaInfo;

    if (simpleType != 0) {

        if (dvType && *dvType) {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::AttributeWithTypeAndSimpleType, name);
        }

        dv = traverseSimpleTypeDecl(simpleType, false);
    }
    else if (!dvType || !*dvType) {
        dv = fDatatypeRegistry->getDatatypeValidator(SchemaSymbols::fgDT_ANYSIMPLETYPE);
    }
    else {

        checkEnumerationRequiredNotation(elem, name, dvType);

        const XMLCh* localPart = getLocalPart(dvType);
        const XMLCh* prefix = getPrefix(dvType);
        const XMLCh* typeURI = resolvePrefixToURI(elem, prefix);
        DatatypeValidator*  dvBack = 0;

        if (XMLString::equals(typeURI, SchemaSymbols::fgURI_SCHEMAFORSCHEMA)) {
            dv = fDatatypeRegistry->getDatatypeValidator(localPart);
            dvBack = dv;
        }
        else { //isn't of the schema for schemas namespace...

            dv = getAttrDatatypeValidatorNS(elem, localPart, typeURI);
            dvBack = dv;

            while(dv != 0 && !XMLString::equals(dv->getTypeUri(), SchemaSymbols::fgURI_SCHEMAFORSCHEMA)) {
                dv = dv->getBaseValidator();
            }

            if(dv)
                localPart = dv->getTypeLocalName();
        }

        if(dv) {
            if (XMLString::equals(localPart,XMLUni::fgIDString)) {
                attType = XMLAttDef::ID;
            }
            else if (XMLString::equals(localPart,XMLUni::fgIDRefString)) {
                attType = XMLAttDef::IDRef;
            }
            else if (XMLString::equals(localPart,XMLUni::fgIDRefsString)) {
                attType = XMLAttDef::IDRefs;
            }
            else if (XMLString::equals(localPart,XMLUni::fgEntityString)) {
                attType = XMLAttDef::Entity;
            }
            else if (XMLString::equals(localPart,XMLUni::fgEntitiesString)) {
                attType = XMLAttDef::Entities;
            }
            else if (XMLString::equals(localPart,XMLUni::fgNmTokenString)) {
                attType = XMLAttDef::NmToken;
            }
            else if (XMLString::equals(localPart,XMLUni::fgNmTokensString)) {
                attType = XMLAttDef::NmTokens;
            }
            else if (XMLString::equals(localPart,XMLUni::fgNotationString)) {
                attType = XMLAttDef::Notation;
            }
            else {
                attType = XMLAttDef::Simple;
            }
        }
        else
            attType = XMLAttDef::Simple;

        dv = dvBack;

        if (!dv) {
            reportSchemaError
            (
                elem
                , XMLUni::fgXMLErrDomain
                , XMLErrs::AttributeSimpleTypeNotFound
                , typeURI
                , localPart
                , name
            );
        }
    }

    // restore schema information, if necessary
    fSchemaInfo = saveInfo;

    bool required = false;
    bool prohibited = false;

    if (useVal && *useVal) {

        if (XMLString::equals(useVal, SchemaSymbols::fgATTVAL_REQUIRED)) {
            required = true;
        }
        else if (XMLString::equals(useVal, SchemaSymbols::fgATTVAL_PROHIBITED)) {
            prohibited = true;
        }
    }

    // validate fixed/default values
    const XMLCh* valueToCheck = defaultVal ? defaultVal : fixedVal;
    bool  ofTypeID = (dv && dv->getType() == DatatypeValidator::ID);

    if (attType == XMLAttDef::Simple && dv && valueToCheck) {

        short wsFacet = dv->getWSFacet();
        if((wsFacet == DatatypeValidator::REPLACE && !XMLString::isWSReplaced(valueToCheck)) ||
           (wsFacet == DatatypeValidator::COLLAPSE && !XMLString::isWSCollapsed(valueToCheck)))
        {
            XMLCh* normalizedValue=XMLString::replicate(valueToCheck, fMemoryManager);
            ArrayJanitor<XMLCh> tempURIName(normalizedValue, fMemoryManager);
            if(wsFacet == DatatypeValidator::REPLACE)
                XMLString::replaceWS(normalizedValue, fMemoryManager);
            else if(wsFacet == DatatypeValidator::COLLAPSE)
                XMLString::collapseWS(normalizedValue, fMemoryManager);
            valueToCheck=fStringPool->getValueForId(fStringPool->addOrFind(normalizedValue));
        }
        try {
            dv->validate(valueToCheck
                      , fSchemaInfo->getValidationContext()
                      , fMemoryManager);
        }
        catch (const XMLException& excep) {
            reportSchemaError(elem, excep);
        }
        catch(const OutOfMemoryException&)
        {
            throw;
        }
        catch(...) {
            reportSchemaError(elem, XMLUni::fgValidityDomain, XMLValid::DatatypeValidationFailure, valueToCheck);
        }
    }
    else if((attType == XMLAttDef::NmTokens || attType==XMLAttDef::IDRefs || attType==XMLAttDef::Entities) &&
            valueToCheck && !XMLString::isWSCollapsed(valueToCheck))
    {
        XMLCh* normalizedValue=XMLString::replicate(valueToCheck, fMemoryManager);
        ArrayJanitor<XMLCh> tempURIName(normalizedValue, fMemoryManager);
        XMLString::collapseWS(normalizedValue, fMemoryManager);
        valueToCheck=fStringPool->getValueForId(fStringPool->addOrFind(normalizedValue));
    }

    if (ofTypeID && valueToCheck) {
        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::AttDeclPropCorrect3, name);
    }

    // check for multiple attributes with type derived from ID
    if (!topLevel && ofTypeID) {

        if (fCurrentAttGroupInfo) {

            if (fCurrentAttGroupInfo->containsTypeWithId()) {

                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::AttGrpPropCorrect3, name);
                return;
            }

            fCurrentAttGroupInfo->setTypeWithId(true);
        }
        else {

            if (typeInfo->containsAttWithTypeId()) {

                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::AttDeclPropCorrect5, name);
                return;
            }

            typeInfo->setAttWithTypeId(true);
        }
    }

    // create SchemaAttDef
    SchemaAttDef* attDef = new (fGrammarPoolMemoryManager) SchemaAttDef
    (
        XMLUni::fgZeroLenString
        , name
        , uriIndex
        , attType
        , XMLAttDef::Implied
        , fGrammarPoolMemoryManager
    );

    attDef->setDatatypeValidator(dv);

    if (prohibited) {
        attDef->setDefaultType(XMLAttDef::Prohibited);
    }
    else if (required) {

        if (fixedVal) {
            attDef->setDefaultType(XMLAttDef::Required_And_Fixed);
        }
        else {
            attDef->setDefaultType(XMLAttDef::Required);
        }
    }
    else {

        if (fixedVal) {
            attDef->setDefaultType(XMLAttDef::Fixed);
        }
        else if (defaultVal) {
            attDef->setDefaultType(XMLAttDef::Default);
        }
    }

    if (valueToCheck) {
        attDef->setValue(valueToCheck);
    }

    if (!janAnnot.isDataNull())
        fSchemaGrammar->putAnnotation(attDef, janAnnot.release());

    if (topLevel)
    {
        fAttributeDeclRegistry->put((void*) fStringPool->getValueForId(fStringPool->addOrFind(name)), attDef);
        attDef->setPSVIScope(PSVIDefs::SCP_GLOBAL);
    }
    else
    {
        if (typeInfo)
        {
            typeInfo->addAttDef(attDef);
            if (!fCurrentAttGroupInfo)
                attDef->setPSVIScope(PSVIDefs::SCP_LOCAL);
        }

        if (fCurrentAttGroupInfo) {
            fCurrentAttGroupInfo->addAttDef(attDef, (typeInfo != 0));
        }
    }
}